

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O0

FRandom * FRandom::StaticFindRNG(char *name)

{
  size_t sVar1;
  FRandom *this;
  bool bVar2;
  FRandom *local_30;
  FRandom *probe;
  FRandom **prev;
  char *pcStack_18;
  DWORD NameCRC;
  char *name_local;
  
  pcStack_18 = name;
  sVar1 = strlen(name);
  prev._4_4_ = CalcCRC32((BYTE *)name,(uint)sVar1);
  if (prev._4_4_ == 0) {
    name_local = (char *)&pr_exrandom;
  }
  else {
    probe = (FRandom *)&RNGList;
    local_30 = RNGList;
    while( true ) {
      bVar2 = false;
      if (local_30 != (FRandom *)0x0) {
        bVar2 = local_30->NameCRC < prev._4_4_;
      }
      if (!bVar2) break;
      probe = (FRandom *)&local_30->Next;
      local_30 = local_30->Next;
    }
    if ((local_30 == (FRandom *)0x0) || (local_30->NameCRC != prev._4_4_)) {
      this = (FRandom *)operator_new(0x70);
      FRandom(this,pcStack_18);
      local_30 = this;
      TArray<FRandom_*,_FRandom_*>::Push(&NewRNGs.super_TArray<FRandom_*,_FRandom_*>,&local_30);
    }
    name_local = (char *)local_30;
  }
  return (FRandom *)name_local;
}

Assistant:

FRandom *FRandom::StaticFindRNG (const char *name)
{
	DWORD NameCRC = CalcCRC32 ((const BYTE *)name, (unsigned int)strlen (name));

	// Use the default RNG if this one happens to have a CRC of 0.
	if (NameCRC == 0) return &pr_exrandom;

	// Find the RNG in the list, sorted by CRC
	FRandom **prev = &RNGList, *probe = RNGList;

	while (probe != NULL && probe->NameCRC < NameCRC)
	{
		prev = &probe->Next;
		probe = probe->Next;
	}
	// Found one so return it.
	if (probe == NULL || probe->NameCRC != NameCRC)
	{
		// A matching RNG doesn't exist yet so create it.
		probe = new FRandom(name);

		// Store the new RNG for destruction when ZDoom quits.
		NewRNGs.Push(probe);
	}
	return probe;
}